

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint local_40;
  uint local_3c;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint32_t *RK;
  uint keybits_local;
  uchar *key_local;
  mbedtls_aes_context *ctx_local;
  
  if (keybits == 0x80) {
    ctx->nr = 10;
  }
  else if (keybits == 0xc0) {
    ctx->nr = 0xc;
  }
  else {
    if (keybits != 0x100) {
      return -0x20;
    }
    ctx->nr = 0xe;
  }
  uVar2 = mbedtls_aes_rk_offset(ctx->buf);
  ctx->rk_offset = (ulong)uVar2;
  _i_1 = ctx->buf + ctx->rk_offset;
  for (i_2 = 0; i_2 < keybits >> 5; i_2 = i_2 + 1) {
    uVar3 = mbedtls_get_unaligned_uint32(key + (i_2 << 2));
    _i_1[i_2] = uVar3;
  }
  iVar1 = ctx->nr;
  if (iVar1 == 10) {
    for (i_3 = 0; i_3 < 10; i_3 = i_3 + 1) {
      _i_1[4] = *_i_1 ^ RCON[i_3] ^ (uint)FSb[_i_1[3] >> 8 & 0xff] ^
                (uint)FSb[_i_1[3] >> 0x10 & 0xff] << 8 ^ (uint)FSb[_i_1[3] >> 0x18] << 0x10 ^
                (uint)FSb[_i_1[3] & 0xff] << 0x18;
      _i_1[5] = _i_1[1] ^ _i_1[4];
      _i_1[6] = _i_1[2] ^ _i_1[5];
      _i_1[7] = _i_1[3] ^ _i_1[6];
      _i_1 = _i_1 + 4;
    }
  }
  else if (iVar1 == 0xc) {
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      _i_1[6] = *_i_1 ^ RCON[local_3c] ^ (uint)FSb[_i_1[5] >> 8 & 0xff] ^
                (uint)FSb[_i_1[5] >> 0x10 & 0xff] << 8 ^ (uint)FSb[_i_1[5] >> 0x18] << 0x10 ^
                (uint)FSb[_i_1[5] & 0xff] << 0x18;
      _i_1[7] = _i_1[1] ^ _i_1[6];
      _i_1[8] = _i_1[2] ^ _i_1[7];
      _i_1[9] = _i_1[3] ^ _i_1[8];
      _i_1[10] = _i_1[4] ^ _i_1[9];
      _i_1[0xb] = _i_1[5] ^ _i_1[10];
      _i_1 = _i_1 + 6;
    }
  }
  else if (iVar1 == 0xe) {
    for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
      _i_1[8] = *_i_1 ^ RCON[local_40] ^ (uint)FSb[_i_1[7] >> 8 & 0xff] ^
                (uint)FSb[_i_1[7] >> 0x10 & 0xff] << 8 ^ (uint)FSb[_i_1[7] >> 0x18] << 0x10 ^
                (uint)FSb[_i_1[7] & 0xff] << 0x18;
      _i_1[9] = _i_1[1] ^ _i_1[8];
      _i_1[10] = _i_1[2] ^ _i_1[9];
      _i_1[0xb] = _i_1[3] ^ _i_1[10];
      _i_1[0xc] = _i_1[4] ^ (uint)FSb[_i_1[0xb] & 0xff] ^ (uint)FSb[_i_1[0xb] >> 8 & 0xff] << 8 ^
                  (uint)FSb[_i_1[0xb] >> 0x10 & 0xff] << 0x10 ^ (uint)FSb[_i_1[0xb] >> 0x18] << 0x18
      ;
      _i_1[0xd] = _i_1[5] ^ _i_1[0xc];
      _i_1[0xe] = _i_1[6] ^ _i_1[0xd];
      _i_1[0xf] = _i_1[7] ^ _i_1[0xe];
      _i_1 = _i_1 + 8;
    }
  }
  return 0;
}

Assistant:

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
    uint32_t *RK;

    switch (keybits) {
        case 128: ctx->nr = 10; break;
#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
        default: return MBEDTLS_ERR_AES_INVALID_KEY_LENGTH;
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if (aes_init_done == 0) {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    for (unsigned int i = 0; i < (keybits >> 5); i++) {
        RK[i] = MBEDTLS_GET_UINT32_LE(key, i << 2);
    }

    switch (ctx->nr) {
        case 10:

            for (unsigned int i = 0; i < 10; i++, RK += 4) {
                RK[4]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[3])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[3])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[3])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[3])] << 24);

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 12:

            for (unsigned int i = 0; i < 8; i++, RK += 6) {
                RK[6]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[5])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[5])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[5])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[5])] << 24);

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for (unsigned int i = 0; i < 7; i++, RK += 8) {
                RK[8]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[7])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[7])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[7])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[7])] << 24);

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[11])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[11])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[11])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[11])] << 24);

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
    }

    return 0;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}